

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

wchar_t archive_entry_update_symlink_utf8(archive_entry *entry,char *linkname)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int *piVar3;
  
  wVar2 = L'\0';
  if ((entry->ae_set & 1U) == 0 || linkname != (char *)0x0) {
    wVar1 = entry->ae_set & 0xfffffffc;
    wVar2 = wVar1 + L'\x02';
    if (linkname == (char *)0x0) {
      wVar2 = wVar1;
    }
    entry->ae_set = wVar2;
    wVar2 = archive_mstring_update_utf8(entry->archive,&entry->ae_linkname,linkname);
    if (wVar2 == L'\0') {
      wVar2 = L'\x01';
    }
    else {
      piVar3 = __errno_location();
      wVar2 = L'\0';
      if (*piVar3 == 0xc) {
        __archive_errx(1,"No memory");
      }
    }
  }
  return wVar2;
}

Assistant:

int
archive_entry_update_symlink_utf8(struct archive_entry *entry, const char *linkname)
{
	if (linkname == NULL && (entry->ae_set & AE_SET_HARDLINK))
		return (0);
	entry->ae_set &= ~AE_SET_HARDLINK;
	if (linkname == NULL)
		entry->ae_set &= ~AE_SET_SYMLINK;
	else
		entry->ae_set |= AE_SET_SYMLINK;
	if (archive_mstring_update_utf8(entry->archive,
	    &entry->ae_linkname, linkname) == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}